

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.h
# Opt level: O0

ServiceServer __thiscall
miniros::NodeHandle::
advertiseService<minibag::Player,std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
          (NodeHandle *this,string *service,offset_in_Player_to_subr srv_func,Player *obj)

{
  string *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  function<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&)>
  *in_RSI;
  AdvertiseServiceOptions *in_RDI;
  ServiceServer SVar1;
  anon_class_24_2_1b3b90ec wrapFn;
  AdvertiseServiceOptions ops;
  AdvertiseServiceOptions *__f;
  AdvertiseServiceOptions *in_stack_fffffffffffffeb0;
  
  __f = in_RDI;
  AdvertiseServiceOptions::AdvertiseServiceOptions(in_RDI);
  std::
  function<bool(std_srvs::SetBoolRequest_<std::allocator<void>>&,std_srvs::SetBoolResponse_<std::allocator<void>>&)>
  ::
  function<miniros::NodeHandle::advertiseService<minibag::Player,std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>(std::__cxx11::string_const&,bool(minibag::Player::*)(std_srvs::SetBoolRequest_<std::allocator<void>>&,std_srvs::SetBoolResponse_<std::allocator<void>>&),minibag::Player*)::_lambda(std_srvs::SetBoolRequest_<std::allocator<void>>&,std_srvs::SetBoolResponse_<std::allocator<void>>&)_1_&,void>
            (in_RSI,(anon_class_24_2_1b3b90ec *)__f);
  AdvertiseServiceOptions::
  init<std_srvs::SetBoolRequest_<std::allocator<void>>,std_srvs::SetBoolResponse_<std::allocator<void>>>
            (in_stack_fffffffffffffeb0,in_RDX,in_RSI);
  std::
  function<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&)>
  ::~function((function<bool_(std_srvs::SetBoolRequest_<std::allocator<void>_>_&,_std_srvs::SetBoolResponse_<std::allocator<void>_>_&)>
               *)0x1c1990);
  miniros::NodeHandle::advertiseService(in_RDI);
  AdvertiseServiceOptions::~AdvertiseServiceOptions(in_RDI);
  SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__f;
  return (ServiceServer)
         SVar1.impl_.super___shared_ptr<miniros::ServiceServer::Impl,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ServiceServer advertiseService(const std::string& service, bool (T::*srv_func)(MReq &, MRes &), T *obj)
  {
    AdvertiseServiceOptions ops;
    auto wrapFn =
      [obj, srv_func](MReq& req, MRes& res)
      {
        return (obj->*srv_func)(req, res);
      };
    ops.template init<MReq, MRes>(service, wrapFn);
    return advertiseService(ops);
  }